

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_io.c
# Opt level: O0

int s3gaudnom_write(char *fn,float32 ***dnom,uint32 n_cb,uint32 n_feat,uint32 n_density)

{
  int iVar1;
  int32 iVar2;
  uint32 *chksum_00;
  undefined4 uVar3;
  uint32 local_40 [2];
  uint32 ignore;
  uint32 chksum;
  FILE *fp;
  uint32 local_28;
  uint32 n_density_local;
  uint32 n_feat_local;
  uint32 n_cb_local;
  float32 ***dnom_local;
  char *fn_local;
  
  local_40[1] = 0;
  local_40[0] = 0;
  fp._4_4_ = n_density;
  local_28 = n_feat;
  n_density_local = n_cb;
  _n_feat_local = dnom;
  dnom_local = (float32 ***)fn;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  _ignore = s3open((char *)dnom_local,"wb",(uint32 *)0x0);
  if (_ignore == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    chksum_00 = local_40 + 1;
    iVar1 = bio_fwrite_3d(_n_feat_local,4,n_density_local,local_28,fp._4_4_,_ignore,chksum_00);
    uVar3 = (undefined4)((ulong)chksum_00 >> 0x20);
    if (iVar1 < 0) {
      s3close(_ignore);
      fn_local._4_4_ = -1;
    }
    else {
      iVar2 = bio_fwrite(local_40 + 1,4,1,_ignore,0,local_40);
      if (iVar2 == 1) {
        s3close(_ignore);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                ,0x255,"Wrote %s [%ux%ux%u array]\n",dnom_local,(ulong)n_density_local,
                CONCAT44(uVar3,local_28),fp._4_4_);
        fn_local._4_4_ = 0;
      }
      else {
        s3close(_ignore);
        fn_local._4_4_ = -1;
      }
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3gaudnom_write(const char *fn,
		float32 ***dnom,
		uint32 n_cb,
		uint32 n_feat,
		uint32 n_density)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", GAUDNOM_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite_3d((void ***)dnom,
		   sizeof(float32),
		   n_cb,
		   n_feat,
		   n_density,
		   fp,
		   &chksum) < 0) {
	s3close(fp);
	return S3_ERROR;
    }
	
    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }
	
    s3close(fp);

    E_INFO("Wrote %s [%ux%ux%u array]\n",
	   fn, n_cb, n_feat, n_density);

    return S3_SUCCESS;
}